

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

CFGNode * __thiscall dxil_spv::CFGNode::get_outer_selection_dominator(CFGNode *this)

{
  bool bVar1;
  bool local_41;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_38;
  CFGNode **local_30;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_28;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_20;
  CFGNode *local_18;
  CFGNode *node;
  CFGNode *this_local;
  
  node = this;
  if (this->immediate_dominator == (CFGNode *)0x0) {
    __assert_fail("immediate_dominator",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/node.cpp"
                  ,0x254,"CFGNode *dxil_spv::CFGNode::get_outer_selection_dominator()");
  }
  local_18 = this->immediate_dominator;
  while( true ) {
    local_41 = false;
    if ((local_18->ir).terminator.type != Switch) {
      local_41 = post_dominates(this,local_18);
    }
    if ((local_41 == false) ||
       (bVar1 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                empty(&local_18->pred), bVar1)) break;
    while( true ) {
      local_28._M_current =
           (CFGNode **)
           std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(&local_18->headers);
      local_30 = (CFGNode **)
                 std::
                 vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                 end(&local_18->headers);
      local_20 = std::
                 find<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGNode*>
                           (local_28,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                      )local_30,&local_18->immediate_dominator);
      local_38._M_current =
           (CFGNode **)
           std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           end(&local_18->headers);
      bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
      if (!bVar1) break;
      local_18 = local_18->immediate_dominator;
    }
    bVar1 = post_dominates(this,local_18);
    if (bVar1) {
      if (local_18->immediate_dominator == (CFGNode *)0x0) {
        __assert_fail("node->immediate_dominator",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/node.cpp"
                      ,0x264,"CFGNode *dxil_spv::CFGNode::get_outer_selection_dominator()");
      }
      local_18 = local_18->immediate_dominator;
    }
  }
  return local_18;
}

Assistant:

CFGNode *CFGNode::get_outer_selection_dominator()
{
	assert(immediate_dominator);
	auto *node = immediate_dominator;

	// We need to find an immediate dominator which we do not post-dominate.
	// That first idom is considered the outer selection header.
	while (node->ir.terminator.type != Terminator::Type::Switch && post_dominates(node))
	{
		if (node->pred.empty())
			break;

		// Skip from merge block to header.
		while (std::find(node->headers.begin(), node->headers.end(), node->immediate_dominator) != node->headers.end())
			node = node->immediate_dominator;

		if (post_dominates(node))
		{
			assert(node->immediate_dominator);
			node = node->immediate_dominator;
		}
	}

	return node;
}